

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module_instrumentation.cpp
# Opt level: O0

Id dxil_spv::build_hash_offset(Builder *builder,Id var_id)

{
  Id IVar1;
  Instruction *this;
  Instruction *this_00;
  Instruction *this_01;
  Instruction *this_02;
  Id glsl;
  Instruction *extract_minus_1;
  Instruction *extract;
  Instruction *find_msb;
  Instruction *len;
  Id var_id_local;
  Builder *builder_local;
  
  IVar1 = spv::Builder::makeUintType(builder,0x20);
  this = spv::Builder::addInstruction(builder,IVar1,OpArrayLength);
  IVar1 = spv::Builder::makeUintType(builder,0x20);
  this_00 = spv::Builder::addInstruction(builder,IVar1,OpExtInst);
  IVar1 = spv::Builder::makeUintType(builder,0x20);
  this_01 = spv::Builder::addInstruction(builder,IVar1,OpBitFieldUExtract);
  IVar1 = spv::Builder::makeUintType(builder,0x20);
  this_02 = spv::Builder::addInstruction(builder,IVar1,OpISub);
  IVar1 = spv::Builder::import(builder,"GLSL.std.450");
  spv::Instruction::addIdOperand(this,var_id);
  spv::Instruction::addImmediateOperand(this,0);
  spv::Instruction::addIdOperand(this_00,IVar1);
  spv::Instruction::addImmediateOperand(this_00,0x4b);
  IVar1 = spv::Instruction::getResultId(this);
  spv::Instruction::addIdOperand(this_00,IVar1);
  IVar1 = spv::Instruction::getResultId(this);
  spv::Instruction::addIdOperand(this_01,IVar1);
  IVar1 = spv::Builder::makeUintConstant(builder,0,false);
  spv::Instruction::addIdOperand(this_01,IVar1);
  IVar1 = spv::Instruction::getResultId(this_00);
  spv::Instruction::addIdOperand(this_01,IVar1);
  IVar1 = spv::Instruction::getResultId(this_01);
  spv::Instruction::addIdOperand(this_02,IVar1);
  IVar1 = spv::Builder::makeUintConstant(builder,1,false);
  spv::Instruction::addIdOperand(this_02,IVar1);
  IVar1 = spv::Instruction::getResultId(this_02);
  return IVar1;
}

Assistant:

static spv::Id build_hash_offset(spv::Builder &builder, spv::Id var_id)
{
	auto *len = builder.addInstruction(builder.makeUintType(32), spv::OpArrayLength);
	auto *find_msb = builder.addInstruction(builder.makeUintType(32), spv::OpExtInst);
	auto *extract = builder.addInstruction(builder.makeUintType(32), spv::OpBitFieldUExtract);
    auto *extract_minus_1 = builder.addInstruction(builder.makeUintType(32), spv::OpISub);

	spv::Id glsl = builder.import("GLSL.std.450");

	len->addIdOperand(var_id);
	len->addImmediateOperand(0);

	find_msb->addIdOperand(glsl);
	find_msb->addImmediateOperand(GLSLstd450FindUMsb);
	find_msb->addIdOperand(len->getResultId());

	extract->addIdOperand(len->getResultId());
	extract->addIdOperand(builder.makeUintConstant(0));
	extract->addIdOperand(find_msb->getResultId());

    extract_minus_1->addIdOperand(extract->getResultId());
    extract_minus_1->addIdOperand(builder.makeUintConstant(1));

    return extract_minus_1->getResultId();
}